

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_dc_top_predictor_4x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint8_t *in_RDX;
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar1 [16];
  uint32_t pred;
  __m128i two;
  __m128i sum_above;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 local_38;
  undefined2 uStack_36;
  undefined2 uStack_34;
  undefined2 uStack_32;
  
  dc_sum_4(in_RDX);
  local_98 = (short)extraout_XMM0_Qa;
  uStack_96 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
  uStack_94 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
  uStack_92 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
  uStack_90 = (short)extraout_XMM0_Qb;
  uStack_8e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
  uStack_8c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
  uStack_8a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
  local_d8._0_4_ = CONCAT22(uStack_96 + 2,local_98 + 2);
  local_d8._0_6_ = CONCAT24(uStack_94 + 2,(uint32_t)local_d8);
  local_d8 = CONCAT26(uStack_92 + 2,(undefined6)local_d8);
  uStack_d0._0_2_ = uStack_90 + 2;
  uStack_d0._2_2_ = uStack_8e + 2;
  uStack_d0._4_2_ = uStack_8c + 2;
  uStack_d0._6_2_ = uStack_8a + 2;
  auVar1._8_8_ = uStack_d0;
  auVar1._0_8_ = local_d8;
  auVar1 = psraw(auVar1,ZEXT416(2));
  auVar1 = pshuflw(auVar1,auVar1,0);
  local_38 = auVar1._0_2_;
  uStack_36 = auVar1._2_2_;
  uStack_34 = auVar1._4_2_;
  uStack_32 = auVar1._6_2_;
  local_d8._0_4_ =
       CONCAT13((0 < uStack_32) * (uStack_32 < 0x100) * auVar1[6] - (0xff < uStack_32),
                CONCAT12((0 < uStack_34) * (uStack_34 < 0x100) * auVar1[4] - (0xff < uStack_34),
                         CONCAT11((0 < uStack_36) * (uStack_36 < 0x100) * auVar1[2] -
                                  (0xff < uStack_36),
                                  (0 < local_38) * (local_38 < 0x100) * auVar1[0] -
                                  (0xff < local_38))));
  dc_store_4xh((uint32_t)local_d8,8,in_RDI,in_RSI);
  return;
}

Assistant:

void aom_dc_top_predictor_4x8_sse2(uint8_t *dst, ptrdiff_t stride,
                                   const uint8_t *above, const uint8_t *left) {
  (void)left;
  __m128i sum_above = dc_sum_4(above);
  const __m128i two = _mm_set1_epi16(2);
  sum_above = _mm_add_epi16(sum_above, two);
  sum_above = _mm_srai_epi16(sum_above, 2);
  sum_above = _mm_shufflelo_epi16(sum_above, 0);
  sum_above = _mm_packus_epi16(sum_above, sum_above);

  const uint32_t pred = (uint32_t)_mm_cvtsi128_si32(sum_above);
  dc_store_4xh(pred, 8, dst, stride);
}